

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O1

int xmlTextWriterStartElementNS
              (xmlTextWriterPtr writer,xmlChar *prefix,xmlChar *name,xmlChar *namespaceURI)

{
  int iVar1;
  xmlChar *pxVar2;
  undefined8 *data;
  xmlLinkPtr pxVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = -1;
  iVar5 = iVar4;
  if ((name != (xmlChar *)0x0 && writer != (xmlTextWriterPtr)0x0) && (*name != '\0')) {
    if (prefix == (xmlChar *)0x0) {
      pxVar2 = (xmlChar *)0x0;
    }
    else {
      pxVar2 = xmlStrdup(prefix);
      pxVar2 = xmlStrcat(pxVar2,":");
    }
    pxVar2 = xmlStrcat(pxVar2,name);
    iVar1 = xmlTextWriterStartElement(writer,pxVar2);
    (*xmlFree)(pxVar2);
    if ((-1 < iVar1) && (iVar5 = iVar1, namespaceURI != (xmlChar *)0x0)) {
      data = (undefined8 *)(*xmlMalloc)(0x18);
      if (data == (undefined8 *)0x0) {
        xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartElementNS : out of memory!\n");
        iVar5 = iVar4;
      }
      else {
        pxVar2 = xmlStrdup("xmlns");
        if (prefix != (xmlChar *)0x0) {
          pxVar2 = xmlStrcat(pxVar2,":");
          pxVar2 = xmlStrcat(pxVar2,prefix);
        }
        *data = pxVar2;
        pxVar2 = xmlStrdup(namespaceURI);
        data[1] = pxVar2;
        if (pxVar2 == (xmlChar *)0x0) {
          xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartElementNS : out of memory!\n")
          ;
          (*xmlFree)(data);
          iVar5 = iVar4;
        }
        else {
          pxVar3 = xmlListFront(writer->nodes);
          data[2] = pxVar3;
          xmlListPushFront(writer->nsstack,data);
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int
xmlTextWriterStartElementNS(xmlTextWriterPtr writer,
                            const xmlChar * prefix, const xmlChar * name,
                            const xmlChar * namespaceURI)
{
    int count;
    int sum;
    xmlChar *buf;

    if ((writer == NULL) || (name == NULL) || (*name == '\0'))
        return -1;

    buf = NULL;
    if (prefix != 0) {
        buf = xmlStrdup(prefix);
        buf = xmlStrcat(buf, BAD_CAST ":");
    }
    buf = xmlStrcat(buf, name);

    sum = 0;
    count = xmlTextWriterStartElement(writer, buf);
    xmlFree(buf);
    if (count < 0)
        return -1;
    sum += count;

    if (namespaceURI != 0) {
        xmlTextWriterNsStackEntry *p = (xmlTextWriterNsStackEntry *)
        xmlMalloc(sizeof(xmlTextWriterNsStackEntry));
        if (p == 0) {
            xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                            "xmlTextWriterStartElementNS : out of memory!\n");
            return -1;
        }

        buf = xmlStrdup(BAD_CAST "xmlns");
        if (prefix != 0) {
            buf = xmlStrcat(buf, BAD_CAST ":");
            buf = xmlStrcat(buf, prefix);
        }

        p->prefix = buf;
        p->uri = xmlStrdup(namespaceURI);
        if (p->uri == 0) {
            xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                            "xmlTextWriterStartElementNS : out of memory!\n");
            xmlFree(p);
            return -1;
        }
        p->elem = xmlListFront(writer->nodes);

        xmlListPushFront(writer->nsstack, p);
    }

    return sum;
}